

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

string * __thiscall
Loader::shiftDR(string *__return_storage_ptr__,Loader *this,int bits,string *write)

{
  Jtag *this_00;
  bool bVar1;
  ostream *poVar2;
  allocator local_71;
  string data;
  string local_50;
  
  bVar1 = Jtag::navigateToState(this->device,this->currentState,SHIFT_DR);
  if (bVar1) {
    this_00 = this->device;
    std::__cxx11::string::string((string *)&local_50,(string *)write);
    Jtag::shiftData(&data,this_00,bits,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (data._M_string_length == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to shift data!");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)0x0,&local_71);
    }
    else {
      bVar1 = Jtag::navigateToState(this->device,EXIT1_DR,RUN_TEST_IDLE);
      if (bVar1) {
        this->currentState = RUN_TEST_IDLE;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)data._M_dataplus._M_p == &data.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(data.field_2._M_allocated_capacity._1_7_,data.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = data.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = data._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(data.field_2._M_allocated_capacity._1_7_,data.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = data._M_string_length;
        data._M_string_length = 0;
        data.field_2._M_local_buf[0] = '\0';
        data._M_dataplus._M_p = (pointer)&data.field_2;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to change to RUN_TEST_IDLE state!");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)0x0,&local_71);
      }
    }
    std::__cxx11::string::~string((string *)&data);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to change to SHIFT_DR state!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)0x0,(allocator *)&data);
  }
  return __return_storage_ptr__;
}

Assistant:

string Loader::shiftDR(int bits, string write) {
	if (!device->navigateToState(currentState, Jtag_fsm::SHIFT_DR)) {
		cerr << "Failed to change to SHIFT_DR state!" << endl;
		return NULL;
	}

	string data = device->shiftData(bits, write);
	if (data.empty()) {
		cerr << "Failed to shift data!" << endl;
		return NULL;
	}
	if (!device->navigateToState(Jtag_fsm::EXIT1_DR, Jtag_fsm::RUN_TEST_IDLE)) {
		cerr << "Failed to change to RUN_TEST_IDLE state!" << endl;
		return NULL;
	}
	currentState = Jtag_fsm::RUN_TEST_IDLE;
	return data;
}